

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_info::torrent_info(torrent_info *this,string *filename,error_code *ec)

{
  sha1_hash *psVar1;
  sha256_hash *psVar2;
  int iVar3;
  span<const_char> buffer;
  vector<char,_std::allocator<char>_> buf;
  bdecode_node e;
  int in_stack_ffffffffffffff50;
  vector<char,_std::allocator<char>_> local_a8;
  copy_ptr<const_libtorrent::file_storage> *local_90;
  bdecode_node local_88;
  load_torrent_limits local_44;
  
  file_storage::file_storage(&this->m_files);
  local_90 = &this->m_orig_files;
  memset(local_90,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_info_dict).m_root_tokens = (bdecode_token *)0x0;
  *(undefined8 *)((long)&(this->m_info_dict).m_root_tokens + 4) = 0;
  *(undefined8 *)((long)&(this->m_info_dict).m_buffer + 4) = 0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  (this->m_info_hash).v1.m_number._M_elems[0] = 0;
  (this->m_info_hash).v1.m_number._M_elems[1] = 0;
  psVar1 = &(this->m_info_hash).v1;
  (psVar1->m_number)._M_elems[2] = 0;
  (psVar1->m_number)._M_elems[3] = 0;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[1] = 0;
  (psVar2->m_number)._M_elems[2] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[3] = 0;
  (psVar2->m_number)._M_elems[4] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[5] = 0;
  (psVar2->m_number)._M_elems[6] = 0;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 7) = 0;
  *(undefined8 *)((long)&this->m_piece_hashes + 1) = 0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar3 = anon_unknown_1::load_file(filename,&local_a8,ec,80000000);
  if (-1 < iVar3) {
    buffer.m_ptr = local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
    buffer.m_len = (difference_type)ec;
    bdecode(&local_88,
            (libtorrent *)
            local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start,buffer,(error_code *)0x0,(int *)0x64,2000000,in_stack_ffffffffffffff50);
    if (ec->failed_ == false) {
      local_44.max_buffer_size = 10000000;
      local_44.max_pieces = 0x200000;
      local_44.max_decode_depth = 100;
      local_44.max_decode_tokens = 3000000;
      local_44.max_duplicate_filenames = 500;
      parse_torrent_file(this,&local_88,ec,&local_44);
    }
    if (local_88.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((libtorrent *)
      local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (libtorrent *)0x0) {
    operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

torrent_info::torrent_info(std::string const& filename, error_code& ec)
	{
		std::vector<char> buf;
		int ret = load_file(filename, buf, ec);
		if (ret < 0) return;

		bdecode_node e = bdecode(buf, ec);
		if (ec) return;
		parse_torrent_file(e, ec, load_torrent_limits{});

		INVARIANT_CHECK;
	}